

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

uint16_t __thiscall double_conversion::Bignum::DivideModuloIntBignum(Bignum *this,Bignum *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Chunk CVar5;
  Chunk *pCVar6;
  Bignum *in_RSI;
  Bignum *in_RDI;
  Bignum *unaff_retaddr;
  int division_estimate;
  int quotient;
  Chunk other_bigit;
  Chunk this_bigit;
  uint16_t result;
  Bignum *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar7;
  undefined2 in_stack_ffffffffffffffe4;
  short sVar8;
  Bignum *pBVar9;
  int factor;
  undefined6 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffe;
  uint16_t uVar10;
  
  pBVar9 = in_RDI;
  iVar2 = BigitLength(in_RDI);
  iVar3 = BigitLength(in_RSI);
  if (iVar2 < iVar3) {
    uVar10 = 0;
  }
  else {
    Align((Bignum *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),in_RDI);
    sVar8 = 0;
    while( true ) {
      iVar2 = BigitLength(in_RDI);
      iVar3 = BigitLength(in_RSI);
      factor = (int)((ulong)pBVar9 >> 0x20);
      if (iVar2 <= iVar3) break;
      pCVar6 = RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
      sVar8 = sVar8 + (short)*pCVar6;
      RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
      SubtractTimes(unaff_retaddr,
                    (Bignum *)CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8),
                    (int)((ulong)pBVar9 >> 0x20));
    }
    pCVar6 = RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
    CVar5 = *pCVar6;
    pCVar6 = RawBigit(in_RSI,in_RSI->used_bigits_ + -1);
    uVar7 = *pCVar6;
    if (in_RSI->used_bigits_ == 1) {
      uVar4 = CVar5 / uVar7;
      CVar5 = CVar5 - uVar7 * uVar4;
      pCVar6 = RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
      *pCVar6 = CVar5;
      uVar10 = sVar8 + (short)uVar4;
      Clamp((Bignum *)CONCAT44(CVar5,in_stack_ffffffffffffffb0));
    }
    else {
      uVar4 = CVar5 / (uVar7 + 1);
      uVar10 = sVar8 + (short)uVar4;
      SubtractTimes(unaff_retaddr,
                    (Bignum *)CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8),factor);
      if (uVar7 * (uVar4 + 1) <= CVar5) {
        while (bVar1 = LessEqual((Bignum *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffa8), bVar1) {
          SubtractBignum((Bignum *)CONCAT26(uVar10,CONCAT24(in_stack_ffffffffffffffe4,CVar5)),
                         (Bignum *)CONCAT44(uVar7,in_stack_ffffffffffffffd8));
          uVar10 = uVar10 + 1;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

uint16_t Bignum::DivideModuloIntBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.used_bigits_ > 0);

  // Easy case: if we have less digits than the divisor than the result is 0.
  // Note: this handles the case where this == 0, too.
  if (BigitLength() < other.BigitLength()) {
    return 0;
  }

  Align(other);

  uint16_t result = 0;

  // Start by removing multiples of 'other' until both numbers have the same
  // number of digits.
  while (BigitLength() > other.BigitLength()) {
    // This naive approach is extremely inefficient if `this` divided by other
    // is big. This function is implemented for doubleToString where
    // the result should be small (less than 10).
    DOUBLE_CONVERSION_ASSERT(other.RawBigit(other.used_bigits_ - 1) >= ((1 << kBigitSize) / 16));
    DOUBLE_CONVERSION_ASSERT(RawBigit(used_bigits_ - 1) < 0x10000);
    // Remove the multiples of the first digit.
    // Example this = 23 and other equals 9. -> Remove 2 multiples.
    result += static_cast<uint16_t>(RawBigit(used_bigits_ - 1));
    SubtractTimes(other, RawBigit(used_bigits_ - 1));
  }

  DOUBLE_CONVERSION_ASSERT(BigitLength() == other.BigitLength());

  // Both bignums are at the same length now.
  // Since other has more than 0 digits we know that the access to
  // RawBigit(used_bigits_ - 1) is safe.
  const Chunk this_bigit = RawBigit(used_bigits_ - 1);
  const Chunk other_bigit = other.RawBigit(other.used_bigits_ - 1);

  if (other.used_bigits_ == 1) {
    // Shortcut for easy (and common) case.
    int quotient = this_bigit / other_bigit;
    RawBigit(used_bigits_ - 1) = this_bigit - other_bigit * quotient;
    DOUBLE_CONVERSION_ASSERT(quotient < 0x10000);
    result += static_cast<uint16_t>(quotient);
    Clamp();
    return result;
  }

  const int division_estimate = this_bigit / (other_bigit + 1);
  DOUBLE_CONVERSION_ASSERT(division_estimate < 0x10000);
  result += static_cast<uint16_t>(division_estimate);
  SubtractTimes(other, division_estimate);

  if (other_bigit * (division_estimate + 1) > this_bigit) {
    // No need to even try to subtract. Even if other's remaining digits were 0
    // another subtraction would be too much.
    return result;
  }

  while (LessEqual(other, *this)) {
    SubtractBignum(other);
    result++;
  }
  return result;
}